

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O3

void __thiscall
rsg::Shader::getOutputs
          (Shader *this,
          vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *outputs)

{
  pointer *pppVVar1;
  pointer ppVVar2;
  iterator __position;
  pointer ppVVar3;
  Variable *var;
  Variable *local_28;
  
  ppVVar2 = (outputs->
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((outputs->super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVVar2) {
    (outputs->super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVVar2;
  }
  ppVVar3 = (this->m_globalScope).m_declaredVariables.
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar3 !=
      (this->m_globalScope).m_declaredVariables.
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_28 = *ppVVar3;
      if (local_28->m_storage == STORAGE_SHADER_OUT) {
        __position._M_current =
             (outputs->
             super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (outputs->
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>::
          _M_realloc_insert<rsg::Variable_const*const&>
                    ((vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>> *)outputs,
                     __position,&local_28);
        }
        else {
          *__position._M_current = local_28;
          pppVVar1 = &(outputs->
                      super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
      }
      ppVVar3 = ppVVar3 + 1;
    } while (ppVVar3 !=
             (this->m_globalScope).m_declaredVariables.
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Shader::getOutputs (vector<const Variable*>& outputs) const
{
	outputs.clear();
	const vector<Variable*>& globalVars = m_globalScope.getDeclaredVariables();
	for (vector<Variable*>::const_iterator i = globalVars.begin(); i != globalVars.end(); i++)
	{
		const Variable* var = *i;
		if (var->getStorage() == Variable::STORAGE_SHADER_OUT)
			outputs.push_back(var);
	}
}